

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Liby::Buffer::prepend(Buffer *this,char *buf,off_t len)

{
  off_t oVar1;
  off_t oVar2;
  undefined1 local_40 [8];
  Buffer nb;
  off_t len_local;
  char *buf_local;
  Buffer *this_local;
  
  nb.capacity_ = len;
  if (buf == (char *)0x0 || len < 1) {
    __assert_fail("buf && len > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                  ,0x8f,"void Liby::Buffer::prepend(const char *, off_t)");
  }
  if (this->leftIndex_ < len) {
    oVar2 = size(this);
    oVar1 = nb.capacity_;
    if (this->capacity_ < len + oVar2) {
      oVar2 = size(this);
      Buffer((Buffer *)local_40,oVar1 + oVar2);
      append((Buffer *)local_40,this);
      swap(this,(Buffer *)local_40);
      ~Buffer((Buffer *)local_40);
    }
    else {
      backward(this,nb.capacity_ - this->leftIndex_);
    }
  }
  safePreappend(this,buf,nb.capacity_);
  return;
}

Assistant:

void Buffer::prepend(const char *buf, off_t len) {
    assert(buf && len > 0);
    if (leftIndex_ >= len) {
        ;
    } else if (len + size() <= capacity_) {
        backward(len - leftIndex_);
    } else {
        Buffer nb(len + size());
        nb.append(*this);
        swap(nb);
    }
    safePreappend(buf, len);
}